

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O1

links_entry * find_entry(archive_entry_linkresolver *res,archive_entry *entry)

{
  uint *puVar1;
  links_entry *plVar2;
  links_entry *plVar3;
  wchar_t wVar4;
  dev_t dVar5;
  ulong uVar6;
  dev_t dVar7;
  ulong uVar8;
  ulong uVar9;
  links_entry *plVar10;
  
  wVar4 = archive_entry_ino_is_set(entry);
  if ((wVar4 != L'\0') && (wVar4 = archive_entry_dev_is_set(entry), wVar4 != L'\0')) {
    if (res->spare != (links_entry *)0x0) {
      archive_entry_free(res->spare->canonical);
      archive_entry_free(res->spare->entry);
      free(res->spare);
      res->spare = (links_entry *)0x0;
    }
    dVar5 = archive_entry_dev(entry);
    uVar6 = archive_entry_ino64(entry);
    uVar9 = res->number_buckets - 1 & (uVar6 ^ dVar5);
    for (plVar10 = res->buckets[uVar9]; plVar10 != (links_entry *)0x0; plVar10 = plVar10->next) {
      if (((plVar10->hash == (uVar6 ^ dVar5)) &&
          (dVar7 = archive_entry_dev(plVar10->canonical), dVar5 == dVar7)) &&
         (uVar8 = archive_entry_ino64(plVar10->canonical), uVar6 == uVar8)) {
        puVar1 = &plVar10->links;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 != 0) {
          return plVar10;
        }
        plVar2 = plVar10->previous;
        if (plVar2 != (links_entry *)0x0) {
          plVar2->next = plVar10->next;
        }
        plVar3 = plVar10->next;
        if (plVar3 != (links_entry *)0x0) {
          plVar3->previous = plVar2;
        }
        if (res->buckets[uVar9] == plVar10) {
          res->buckets[uVar9] = plVar3;
        }
        res->number_entries = res->number_entries - 1;
        res->spare = plVar10;
        return plVar10;
      }
    }
  }
  return (links_entry *)0x0;
}

Assistant:

static struct links_entry *
find_entry(struct archive_entry_linkresolver *res,
    struct archive_entry *entry)
{
	struct links_entry	*le;
	size_t			 hash, bucket;
	dev_t			 dev;
	int64_t			 ino;

	if (!archive_entry_ino_is_set(entry) || !archive_entry_dev_is_set(entry)) {
		return (NULL);
	}

	/* Free a held entry. */
	if (res->spare != NULL) {
		archive_entry_free(res->spare->canonical);
		archive_entry_free(res->spare->entry);
		free(res->spare);
		res->spare = NULL;
	}

	dev = archive_entry_dev(entry);
	ino = archive_entry_ino64(entry);
	hash = (size_t)(dev ^ ino);

	/* Try to locate this entry in the links cache. */
	bucket = hash & (res->number_buckets - 1);
	for (le = res->buckets[bucket]; le != NULL; le = le->next) {
		if (le->hash == hash
		    && dev == archive_entry_dev(le->canonical)
		    && ino == archive_entry_ino64(le->canonical)) {
			/*
			 * Decrement link count each time and release
			 * the entry if it hits zero.  This saves
			 * memory and is necessary for detecting
			 * missed links.
			 */
			--le->links;
			if (le->links > 0)
				return (le);
			/* Remove it from this hash bucket. */
			if (le->previous != NULL)
				le->previous->next = le->next;
			if (le->next != NULL)
				le->next->previous = le->previous;
			if (res->buckets[bucket] == le)
				res->buckets[bucket] = le->next;
			res->number_entries--;
			/* Defer freeing this entry. */
			res->spare = le;
			return (le);
		}
	}
	return (NULL);
}